

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall Assimp::SMDImporter::ParseFile(SMDImporter *this)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  byte *in_RAX;
  vector<char,_std::allocator<char>_> *pvVar5;
  Logger *this_00;
  ulong uVar6;
  byte *__s2;
  byte *local_38;
  
  pvVar5 = &this->mBuffer;
  local_38 = in_RAX;
LAB_00609afe:
  __s2 = (byte *)(pvVar5->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  uVar3 = this->iLineNumber;
  this->iLineNumber = uVar3 + 1;
  for (; uVar6 = (ulong)*__s2, uVar6 < 0x21; __s2 = __s2 + 1) {
    if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) {
      if (uVar6 == 0) {
        return;
      }
      break;
    }
  }
  iVar4 = strncmp("version",(char *)__s2,7);
  if (iVar4 == 0) {
    bVar2 = __s2[7];
    if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
    goto LAB_00609b4c;
    local_38 = __s2 + 8;
    if (bVar2 == 0) {
      local_38 = __s2 + 7;
    }
    for (; (bVar2 = *local_38, bVar2 == 0x20 || (bVar2 == 9)); local_38 = local_38 + 1) {
    }
    if ((bVar2 < 0xe) && ((0x3401U >> (bVar2 & 0x1f) & 1) != 0)) {
      return;
    }
    if (0xf5 < (byte)(bVar2 - 0x3a)) goto code_r0x00609cac;
    goto LAB_00609cd8;
  }
LAB_00609b4c:
  iVar4 = strncmp("nodes",(char *)__s2,5);
  if (iVar4 == 0) {
    bVar2 = __s2[5];
    if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      local_38 = __s2 + 6;
      if (bVar2 == 0) {
        local_38 = __s2 + 5;
      }
      ParseNodesSection(this,(char *)local_38,(char **)&local_38);
      pvVar5 = (vector<char,_std::allocator<char>_> *)&local_38;
      goto LAB_00609afe;
    }
  }
  iVar4 = strncmp("triangles",(char *)__s2,9);
  if (iVar4 == 0) {
    bVar2 = __s2[9];
    if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      local_38 = __s2 + 10;
      if (bVar2 == 0) {
        local_38 = __s2 + 9;
      }
      ParseTrianglesSection(this,(char *)local_38,(char **)&local_38);
      pvVar5 = (vector<char,_std::allocator<char>_> *)&local_38;
      goto LAB_00609afe;
    }
  }
  iVar4 = strncmp("vertexanimation",(char *)__s2,0xf);
  if (iVar4 == 0) {
    bVar2 = __s2[0xf];
    if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      local_38 = __s2 + 0x10;
      if (bVar2 == 0) {
        local_38 = __s2 + 0xf;
      }
      this->bHasUVs = false;
      ParseVASection(this,(char *)local_38,(char **)&local_38);
      pvVar5 = (vector<char,_std::allocator<char>_> *)&local_38;
      goto LAB_00609afe;
    }
  }
  iVar4 = strncmp("skeleton",(char *)__s2,8);
  if (iVar4 == 0) {
    bVar2 = __s2[8];
    if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
      local_38 = __s2 + 9;
      if (bVar2 == 0) {
        local_38 = __s2 + 8;
      }
      ParseSkeletonSection(this,(char *)local_38,(char **)&local_38);
      pvVar5 = (vector<char,_std::allocator<char>_> *)&local_38;
      goto LAB_00609afe;
    }
  }
  while ((0xd < (byte)uVar6 || ((0x2401U >> ((uint)uVar6 & 0x1f) & 1) == 0))) {
    uVar6 = (ulong)__s2[1];
    __s2 = __s2 + 1;
  }
  while (((char)uVar6 == '\r' || ((int)uVar6 == 10))) {
    pbVar1 = __s2 + 1;
    __s2 = __s2 + 1;
    uVar6 = (ulong)*pbVar1;
  }
  local_38 = __s2;
  this->iLineNumber = uVar3 + 2;
  pvVar5 = (vector<char,_std::allocator<char>_> *)&local_38;
  goto LAB_00609afe;
code_r0x00609cac:
  iVar4 = 0;
  do {
    iVar4 = (uint)(byte)(bVar2 - 0x30) + iVar4 * 10;
    bVar2 = local_38[1];
    local_38 = local_38 + 1;
  } while (0xf5 < (byte)(bVar2 - 0x3a));
  pvVar5 = (vector<char,_std::allocator<char>_> *)&local_38;
  if (iVar4 != 1) {
LAB_00609cd8:
    this_00 = DefaultLogger::get();
    Logger::warn(this_00,
                 "SMD.version is not 1. This file format is not known. Continuing happily ...");
    pvVar5 = (vector<char,_std::allocator<char>_> *)&local_38;
  }
  goto LAB_00609afe;
}

Assistant:

void SMDImporter::ParseFile() {
    const char* szCurrent = &mBuffer[0];

    // read line per line ...
    for ( ;; ) {
        if(!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "version <n> \n", <n> should be 1 for hl and hl2 SMD files
        if (TokenMatch(szCurrent,"version",7)) {
            if(!SkipSpaces(szCurrent,&szCurrent)) break;
            if (1 != strtoul10(szCurrent,&szCurrent)) {
                ASSIMP_LOG_WARN("SMD.version is not 1. This "
                    "file format is not known. Continuing happily ...");
            }
            continue;
        }
        // "nodes\n" - Starts the node section
        if (TokenMatch(szCurrent,"nodes",5)) {
            ParseNodesSection(szCurrent,&szCurrent);
            continue;
        }
        // "triangles\n" - Starts the triangle section
        if (TokenMatch(szCurrent,"triangles",9)) {
            ParseTrianglesSection(szCurrent,&szCurrent);
            continue;
        }
        // "vertexanimation\n" - Starts the vertex animation section
        if (TokenMatch(szCurrent,"vertexanimation",15)) {
            bHasUVs = false;
            ParseVASection(szCurrent,&szCurrent);
            continue;
        }
        // "skeleton\n" - Starts the skeleton section
        if (TokenMatch(szCurrent,"skeleton",8)) {
            ParseSkeletonSection(szCurrent,&szCurrent);
            continue;
        }
        SkipLine(szCurrent,&szCurrent);
    }
}